

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_stress.c
# Opt level: O1

void client(void *arg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  char msg [3];
  char local_33 [3];
  
  sVar4 = strlen(local_33);
  iVar1 = (int)sVar4 + 1;
  iVar5 = -10;
  while( true ) {
    iVar2 = nn_socket(1,0x50);
    if (iVar2 < 0) break;
    iVar3 = nn_connect(iVar2,"ipc://test-stress.ipc");
    if (iVar3 < 0) goto LAB_001019f9;
    nn_sleep(0x32);
    iVar3 = nn_send(iVar2,local_33,(long)iVar1,0);
    nn_sleep(100);
    if (iVar3 != iVar1) goto LAB_001019fe;
    nn_close(iVar2);
    iVar5 = iVar5 + 1;
    if (iVar5 == 0) {
      return;
    }
  }
  client_cold_3();
LAB_001019f9:
  client_cold_2();
LAB_001019fe:
  client_cold_1();
}

Assistant:

static void client(void *arg)
{
    intptr_t id = (intptr_t)arg;
    int bytes;
    char msg[3];
    int sz_msg;
    int i;

    msg[0] = 'A' + id%26;
    msg[1] = 'a';
    msg[2] = '\0';
    sz_msg = strlen (msg) + 1; // '\0' too

    for (i = 0; i < TEST_LOOPS; i++) {
        int cli_sock = nn_socket(AF_SP, NN_PUSH);
        msg[1] = 'a' + i%26;
        nn_assert(cli_sock >= 0);
        nn_assert(nn_connect(cli_sock, SOCKET_ADDRESS) >= 0);
        /*  Give time to allow for connect to establish. */
        nn_sleep(50);
        bytes = nn_send(cli_sock, msg, sz_msg, 0);
        /*  This would better be handled via semaphore or condvar. */
        nn_sleep(100);
        nn_assert(bytes == sz_msg);
        nn_close(cli_sock);
    }
}